

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O2

void __thiscall
wasm::Pusher::Pusher
          (Pusher *this,Block *block,LocalAnalyzer *analyzer,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *numGetsSoFar,PassOptions *passOptions
          ,Module *module)

{
  ulong uVar1;
  bool bVar2;
  Index IVar3;
  ulong uVar4;
  Expression **ppEVar5;
  LocalSet *pLVar6;
  Index firstPushable;
  ulong index;
  
  this->list = &block->list;
  this->analyzer = analyzer;
  this->numGetsSoFar = numGetsSoFar;
  this->passOptions = passOptions;
  this->module = module;
  (this->pushableEffects)._M_h._M_buckets = &(this->pushableEffects)._M_h._M_single_bucket;
  (this->pushableEffects)._M_h._M_bucket_count = 1;
  (this->pushableEffects)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pushableEffects)._M_h._M_element_count = 0;
  (this->pushableEffects)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->pushableEffects)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->pushableEffects)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  uVar1 = 0;
  uVar4 = 0xffffffff;
  do {
    while( true ) {
      index = uVar1;
      IVar3 = (Index)index;
      if ((this->list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
          usedElements <= index) {
        return;
      }
      ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&this->list->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,index);
      firstPushable = (Index)uVar4;
      if (firstPushable == 0xffffffff) break;
      bVar2 = isPushPoint(this,*ppEVar5);
      if (bVar2) {
        optimizeIntoIf(this,firstPushable,IVar3);
        uVar1 = index;
        uVar4 = 0xffffffff;
        if (index < (this->list->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                    usedElements - 1) {
          IVar3 = optimizeSegment(this,firstPushable,IVar3);
          uVar1 = (ulong)IVar3;
          uVar4 = 0xffffffff;
        }
      }
      else {
LAB_00997157:
        uVar1 = (ulong)(IVar3 + 1);
      }
    }
    pLVar6 = isPushable(this,*ppEVar5);
    if (pLVar6 == (LocalSet *)0x0) goto LAB_00997157;
    uVar1 = (ulong)(IVar3 + 1);
    uVar4 = index;
  } while( true );
}

Assistant:

Pusher(Block* block,
         LocalAnalyzer& analyzer,
         std::vector<Index>& numGetsSoFar,
         PassOptions& passOptions,
         Module& module)
    : list(block->list), analyzer(analyzer), numGetsSoFar(numGetsSoFar),
      passOptions(passOptions), module(module) {
    // Find an optimization segment: from the first pushable thing, to the first
    // point past which we want to push. We then push in that range before
    // continuing forward.
    const Index nothing = -1;
    Index i = 0;
    Index firstPushable = nothing;
    while (i < list.size()) {
      if (firstPushable == nothing && isPushable(list[i])) {
        firstPushable = i;
        i++;
        continue;
      }
      if (firstPushable != nothing && isPushPoint(list[i])) {
        // Optimize this segment, and proceed from where it tells us. First
        // optimize things into the if, if possible, which does not move the
        // push point. Then move things past the push point (which has the
        // relative effect of moving the push point backwards as other things
        // move forward).
        optimizeIntoIf(firstPushable, i);
        // We never need to push past a final element, as we couldn't be used
        // after it.
        if (i < list.size() - 1) {
          i = optimizeSegment(firstPushable, i);
        }
        firstPushable = nothing;
        continue;
      }
      i++;
    }
  }